

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void parse_weight_vector(T1_Face face,T1_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  FT_Fixed FVar3;
  FT_Byte *old_limit;
  FT_Byte *old_cursor;
  FT_Int n;
  T1_Token token;
  PS_Blend blend;
  T1_Parser parser;
  FT_Error error;
  FT_Int num_designs;
  T1_TokenRec design_tokens [16];
  T1_Loader loader_local;
  T1_Face face_local;
  
  parser._0_4_ = 0;
  token = (T1_Token)face->blend;
  design_tokens[0xf]._16_8_ = loader;
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,(T1_Token)&error,0x10,(FT_Int *)((long)&parser + 4));
  if ((int)parser._4_4_ < 0) {
    parser._0_4_ = 0xa2;
  }
  else if ((parser._4_4_ == 0) || (0x10 < (int)parser._4_4_)) {
    parser._0_4_ = 3;
  }
  else {
    if (((PS_Blend)token == (PS_Blend)0x0) || (((PS_Blend)token)->num_designs == 0)) {
      parser._0_4_ = t1_allocate_blend(face,parser._4_4_,0);
      if ((FT_Error)parser != 0) goto LAB_001bd13a;
      token = (T1_Token)face->blend;
    }
    else if (((PS_Blend)token)->num_designs != parser._4_4_) {
      parser._0_4_ = 3;
      goto LAB_001bd13a;
    }
    pFVar1 = (loader->parser).root.cursor;
    pFVar2 = (loader->parser).root.limit;
    for (old_cursor._4_4_ = 0; old_cursor._4_4_ < (int)parser._4_4_;
        old_cursor._4_4_ = old_cursor._4_4_ + 1) {
      (loader->parser).root.cursor = *(FT_Byte **)(&error + (long)old_cursor._4_4_ * 6);
      (loader->parser).root.limit = design_tokens[old_cursor._4_4_].start;
      FVar3 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
      *(FT_Fixed *)(token[0xb].start + (long)old_cursor._4_4_ * 8) = FVar3;
      *(FT_Fixed *)(token[0xb].limit + (long)old_cursor._4_4_ * 8) = FVar3;
    }
    (loader->parser).root.cursor = pFVar1;
    (loader->parser).root.limit = pFVar2;
  }
LAB_001bd13a:
  (loader->parser).root.error = (FT_Error)parser;
  return;
}

Assistant:

static void
  parse_weight_vector( T1_Face    face,
                       T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Error     error  = FT_Err_Ok;
    T1_Parser    parser = &loader->parser;
    PS_Blend     blend  = face->blend;
    T1_Token     token;
    FT_Int       n;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;


    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !blend || !blend->num_designs )
    {
      error = t1_allocate_blend( face, (FT_UInt)num_designs, 0 );
      if ( error )
        goto Exit;
      blend = face->blend;
    }
    else if ( blend->num_designs != (FT_UInt)num_designs )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " /BlendDesignPosition and /WeightVector have\n"
                 "                    "
                 " different number of elements\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    old_cursor = parser->root.cursor;
    old_limit  = parser->root.limit;

    for ( n = 0; n < num_designs; n++ )
    {
      token = design_tokens + n;
      parser->root.cursor = token->start;
      parser->root.limit  = token->limit;

      blend->default_weight_vector[n] =
      blend->weight_vector[n]         = T1_ToFixed( parser, 0 );
    }

    parser->root.cursor = old_cursor;
    parser->root.limit  = old_limit;

  Exit:
    parser->root.error = error;
  }